

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Basic.cpp
# Opt level: O0

int main(void)

{
  ErrorException *ex;
  string local_c0 [32];
  string local_a0 [48];
  undefined1 local_70 [8];
  Program program;
  EvalState state;
  
  EvalState::EvalState
            ((EvalState *)&program.list_of_program._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  Program::Program((Program *)local_70);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"",(allocator *)((long)&ex + 7));
    getLine(local_a0);
    processLine(local_a0,(Program *)local_70,
                (EvalState *)
                &program.list_of_program._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ex + 7));
  } while( true );
}

Assistant:

int main() {
   EvalState state;
   Program program;
   //cout << "Stub implementation of BASIC" << endl;
   while (true) {
      try {
         processLine(getLine(), program, state);
      } catch (ErrorException & ex) {
         cerr << "Error: " << ex.getMessage() << endl;
      }
   }
   return 0;
}